

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

StringNew * __thiscall MixedArena::alloc<wasm::StringNew>(MixedArena *this)

{
  StringNew *this_00;
  StringNew *ret;
  MixedArena *this_local;
  
  this_00 = (StringNew *)allocSpace(this,0x30,8);
  ::wasm::StringNew::StringNew(this_00,this);
  return this_00;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }